

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * __thiscall ghc::filesystem::path::lexically_normal(path *__return_storage_ptr__,path *this)

{
  size_t __n;
  int iVar1;
  format fmt;
  ulong uVar3;
  _Alloc_hider _Var4;
  pointer __s1;
  bool bVar5;
  bool bVar6;
  path root;
  string_type s;
  iterator __begin2;
  iterator __end2;
  const_iterator local_180;
  long local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  path local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  impl_string_type local_120;
  path *local_100;
  const_iterator local_f8;
  iterator local_f0;
  iterator local_b0;
  iterator local_70;
  const_iterator cVar2;
  
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_string_length = 0;
  (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  local_180._M_current = (this->_path)._M_dataplus._M_p;
  local_f0._first._M_current = local_180._M_current + (this->_path)._M_string_length;
  local_70._first._M_current = local_180._M_current;
  iterator::iterator(&local_b0,&local_70._first,&local_f0._first,&local_180);
  local_f0._first._M_current = (this->_path)._M_dataplus._M_p;
  local_180._M_current = local_f0._first._M_current + (this->_path)._M_string_length;
  local_140._M_dataplus._M_p = local_180._M_current;
  local_100 = this;
  iterator::iterator(&local_70,&local_f0._first,&local_180,(const_iterator *)&local_140);
  bVar6 = false;
  do {
    if (local_b0._iter._M_current == local_70._iter._M_current) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._current._path._M_dataplus._M_p != &local_70._current._path.field_2) {
        operator_delete(local_70._current._path._M_dataplus._M_p,
                        local_70._current._path.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._current._path._M_dataplus._M_p != &local_b0._current._path.field_2) {
        operator_delete(local_b0._current._path._M_dataplus._M_p,
                        local_b0._current._path.field_2._M_allocated_capacity + 1);
      }
      if ((__return_storage_ptr__->_path)._M_string_length == 0) {
        assign<char[2]>(__return_storage_ptr__,(char (*) [2])0x18e709);
      }
      return __return_storage_ptr__;
    }
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,local_b0._current._path._M_dataplus._M_p,
               local_b0._current._path._M_dataplus._M_p + local_b0._current._path._M_string_length);
    iVar1 = std::__cxx11::string::compare((char *)&local_140);
    if (iVar1 == 0) {
      append<char[1]>(__return_storage_ptr__,(char (*) [1])0x190102);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&local_140);
      if ((iVar1 == 0) && ((__return_storage_ptr__->_path)._M_string_length != 0)) {
        root_path(&local_160,local_100);
        _Var4._M_p = local_160._path._M_dataplus._M_p;
        __n = (__return_storage_ptr__->_path)._M_string_length;
        if (__n == local_160._path._M_string_length) {
          if (__n != 0) {
            __s1 = (__return_storage_ptr__->_path)._M_dataplus._M_p;
            iVar1 = bcmp(__s1,local_160._path._M_dataplus._M_p,__n);
            if (iVar1 != 0) goto LAB_00153cd6;
          }
        }
        else {
          __s1 = (__return_storage_ptr__->_path)._M_dataplus._M_p;
LAB_00153cd6:
          local_120._M_dataplus._M_p = __s1 + __n;
          local_180._M_current = __s1;
          local_f8._M_current = local_120._M_dataplus._M_p;
          iterator::iterator(&local_f0,&local_180,(const_iterator *)&local_120,&local_f8);
          local_f0._iter = iterator::decrement(&local_f0,&local_f0._iter);
          iterator::updateCurrent(&local_f0);
          local_180._M_current = (char *)&local_170;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"..","");
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          cVar2._M_current = local_180._M_current;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_120,local_180._M_current,local_180._M_current + local_178);
          fmt = (format)cVar2._M_current;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_current != &local_170) {
            uVar3 = local_170._M_allocated_capacity + 1;
            operator_delete(local_180._M_current,uVar3);
            fmt = (format)uVar3;
          }
          postprocess_path_with_format(&local_120,fmt);
          _Var4._M_p = local_120._M_dataplus._M_p;
          if (local_f0._current._path._M_string_length == local_120._M_string_length) {
            if (local_f0._current._path._M_string_length == 0) {
              bVar5 = false;
            }
            else {
              iVar1 = bcmp(local_f0._current._path._M_dataplus._M_p,local_120._M_dataplus._M_p,
                           local_f0._current._path._M_string_length);
              bVar5 = iVar1 != 0;
            }
          }
          else {
            bVar5 = true;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var4._M_p != &local_120.field_2) {
            operator_delete(_Var4._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._current._path._M_dataplus._M_p != &local_f0._current._path.field_2) {
            operator_delete(local_f0._current._path._M_dataplus._M_p,
                            local_f0._current._path.field_2._M_allocated_capacity + 1);
          }
          if (!bVar5) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._path._M_dataplus._M_p != &local_160._path.field_2) {
              operator_delete(local_160._path._M_dataplus._M_p,
                              local_160._path.field_2._M_allocated_capacity + 1);
            }
            goto LAB_00153ea4;
          }
          if ((__return_storage_ptr__->_path)._M_dataplus._M_p
              [(__return_storage_ptr__->_path)._M_string_length - 1] == '/') {
            std::__cxx11::string::pop_back();
          }
          remove_filename(__return_storage_ptr__);
          _Var4._M_p = local_160._path._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var4._M_p != &local_160._path.field_2) {
          operator_delete(_Var4._M_p,local_160._path.field_2._M_allocated_capacity + 1);
        }
      }
      else {
LAB_00153ea4:
        if (!(bool)(bVar6 & local_140._M_string_length == 0)) {
          append<std::__cxx11::string>(__return_storage_ptr__,&local_140);
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_140);
        bVar6 = iVar1 == 0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    iterator::operator++(&local_b0);
  } while( true );
}

Assistant:

GHC_INLINE path path::lexically_normal() const
{
    path dest;
    bool lastDotDot = false;
    for (string_type s : *this) {
        if (s == ".") {
            dest /= "";
            continue;
        }
        else if (s == ".." && !dest.empty()) {
            auto root = root_path();
            if (dest == root) {
                continue;
            }
            else if (*(--dest.end()) != "..") {
                if (dest._path.back() == generic_separator) {
                    dest._path.pop_back();
                }
                dest.remove_filename();
                continue;
            }
        }
        if (!(s.empty() && lastDotDot)) {
            dest /= s;
        }
        lastDotDot = s == "..";
    }
    if (dest.empty()) {
        dest = ".";
    }
    return dest;
}